

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::GraphicsRobustAccessPass::ProcessAFunction
          (GraphicsRobustAccessPass *this,Function *function)

{
  byte bVar1;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  GraphicsRobustAccessPass *this_00;
  pointer ppIVar4;
  pointer ppIVar5;
  Instruction *inst;
  Instruction **ppIVar6;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_01;
  pointer puVar7;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> access_chains;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_texel_pointers;
  Instruction *local_80;
  GraphicsRobustAccessPass *local_78;
  pointer local_70;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_68
  ;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48
  ;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = (function->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (puVar7 = (function->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar4 = local_68._M_impl.super__Vector_impl_data._M_finish, this_00 = local_78,
      ppIVar5 = local_68._M_impl.super__Vector_impl_data._M_start, puVar7 != local_70;
      puVar7 = puVar7 + 1) {
    pBVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar6 = (Instruction **)
              ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (pIVar3 = *ppIVar6,
          pIVar3 != (Instruction *)
                    ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    {
      this_01 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                &local_68;
      if ((pIVar3->opcode_ - OpAccessChain < 2) ||
         (this_01 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                     *)&local_48, pIVar3->opcode_ == OpImageTexelPointer)) {
        local_80 = pIVar3;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>(this_01,&local_80);
      }
      ppIVar6 = &(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  }
  do {
    if (ppIVar5 == ppIVar4) break;
    ClampIndicesForAccessChain(this_00,*ppIVar5);
    ppIVar5 = ppIVar5 + 1;
  } while ((this_00->super_Pass).field_0x35 != '\x01');
  bVar1 = (this_00->super_Pass).field_0x34;
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_48);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_68);
  return (bool)(bVar1 & 1);
}

Assistant:

bool GraphicsRobustAccessPass::ProcessAFunction(opt::Function* function) {
  // Ensure that all pointers computed inside a function are within bounds.
  // Find the access chains in this block before trying to modify them.
  std::vector<Instruction*> access_chains;
  std::vector<Instruction*> image_texel_pointers;
  for (auto& block : *function) {
    for (auto& inst : block) {
      switch (inst.opcode()) {
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
          access_chains.push_back(&inst);
          break;
        case spv::Op::OpImageTexelPointer:
          image_texel_pointers.push_back(&inst);
          break;
        default:
          break;
      }
    }
  }
  for (auto* inst : access_chains) {
    ClampIndicesForAccessChain(inst);
    if (module_status_.failed) return module_status_.modified;
  }

  for (auto* inst : image_texel_pointers) {
    if (SPV_SUCCESS != ClampCoordinateForImageTexelPointer(inst)) break;
  }
  return module_status_.modified;
}